

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O2

void PopIStack(TidyDocImpl *doc)

{
  Lexer *pLVar1;
  IStack *pIVar2;
  AttVal *av;
  uint uVar3;
  
  pLVar1 = doc->lexer;
  uVar3 = pLVar1->istacksize - 1;
  pLVar1->istacksize = uVar3;
  pIVar2 = pLVar1->istack;
  while (av = pIVar2[uVar3].attributes, av != (AttVal *)0x0) {
    pIVar2[uVar3].attributes = av->next;
    prvTidyFreeAttribute(doc,av);
  }
  (*doc->allocator->vtbl->free)(doc->allocator,pIVar2[uVar3].element);
  pIVar2[uVar3].element = (tmbstr)0x0;
  return;
}

Assistant:

static void PopIStack( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    IStack *istack;
    AttVal *av;

    --(lexer->istacksize);
    istack = &(lexer->istack[lexer->istacksize]);

    while (istack->attributes)
    {
        av = istack->attributes;
        istack->attributes = av->next;
        TY_(FreeAttribute)( doc, av );
    }
    TidyDocFree(doc, istack->element);
    istack->element = NULL; /* remove the freed element */
}